

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel_solve.cpp
# Opt level: O0

bool __thiscall Clasp::mt::ParallelSolve::SharedData::clearControl(SharedData *this,uint32 flags)

{
  uint uVar1;
  atomic<unsigned_int> *paVar2;
  bool bVar3;
  uint uStack_6c;
  uint32 flags_local;
  SharedData *this_local;
  
  paVar2 = &this->control;
  uStack_6c = (paVar2->super___atomic_base<unsigned_int>)._M_i;
  do {
    LOCK();
    uVar1 = (paVar2->super___atomic_base<unsigned_int>)._M_i;
    bVar3 = uStack_6c == uVar1;
    if (bVar3) {
      (paVar2->super___atomic_base<unsigned_int>)._M_i = uStack_6c & ~flags;
      uVar1 = uStack_6c;
    }
    UNLOCK();
    uStack_6c = uVar1;
  } while (!bVar3);
  return (uVar1 & flags) == flags;
}

Assistant:

bool clearControl(uint32 flags) { return (control.fetch_and(~flags) & flags) == flags; }